

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

bool embree::sse42::
     BVHNIntersectorKHybrid<4,_4,_16777232,_true,_embree::sse42::ArrayIntersectorK_1<4,_embree::sse42::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded1(Intersectors *This,BVH *bvh,NodeRef root,size_t k,Precalculations *pre,RayK<4> *ray
                ,TravRayK<4,_true> *tray,RayQueryContext *context)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  undefined8 *puVar6;
  float *pfVar7;
  float *pfVar8;
  float *pfVar9;
  float *pfVar10;
  float *pfVar11;
  float *pfVar12;
  float *pfVar13;
  float *pfVar14;
  float *pfVar15;
  float *pfVar16;
  float *pfVar17;
  float *pfVar18;
  float *pfVar19;
  float *pfVar20;
  undefined8 *puVar21;
  float *pfVar22;
  float *pfVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  Ref<embree::Geometry> *pRVar26;
  Geometry *pGVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  RTCFilterFunctionN p_Var35;
  bool bVar36;
  bool bVar37;
  bool bVar38;
  bool bVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined8 uVar45;
  undefined8 uVar46;
  undefined8 uVar47;
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  AABBNodeMB4D *node1;
  ulong uVar50;
  long lVar51;
  ulong uVar52;
  ulong uVar53;
  ulong uVar54;
  ulong uVar55;
  uint uVar56;
  undefined1 (*pauVar57) [16];
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  int iVar61;
  undefined1 (*pauVar62) [16];
  ulong uVar63;
  Scene *pSVar64;
  NodeRef *pNVar65;
  long lVar66;
  long lVar67;
  ulong uVar68;
  ulong uVar69;
  size_t sVar70;
  ulong uVar71;
  float fVar72;
  float fVar73;
  float fVar74;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  float fVar90;
  float fVar91;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  uint uVar106;
  uint uVar114;
  uint uVar115;
  undefined1 auVar107 [16];
  uint uVar116;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  float fVar117;
  float fVar123;
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  float fVar124;
  float fVar129;
  float fVar130;
  undefined1 auVar125 [16];
  float fVar131;
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  float fVar132;
  float fVar134;
  float fVar135;
  float fVar136;
  undefined1 auVar133 [16];
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar144;
  float fVar145;
  float fVar146;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  float fVar149;
  float fVar151;
  float fVar152;
  undefined1 auVar150 [16];
  float fVar153;
  float fVar154;
  float fVar155;
  float fVar157;
  float fVar158;
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  float fVar163;
  float fVar164;
  float fVar165;
  undefined1 auVar156 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  float fVar169;
  float fVar170;
  float fVar171;
  float fVar172;
  float fVar173;
  float fVar174;
  float fVar175;
  float fVar176;
  float fVar178;
  float fVar179;
  float fVar180;
  float fVar181;
  float fVar182;
  undefined1 auVar177 [16];
  float fVar183;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  float local_d38;
  float fStack_d34;
  float fStack_d30;
  float fStack_d2c;
  float fStack_d20;
  float fStack_d1c;
  float fStack_d00;
  float fStack_cfc;
  NodeRef *local_cf0;
  float local_cc8;
  float fStack_cc4;
  float fStack_cc0;
  float fStack_ca0;
  float fStack_c9c;
  undefined8 local_c98;
  float fStack_c90;
  float fStack_c8c;
  undefined1 local_c88 [16];
  Scene *scene;
  float local_c68;
  float fStack_c64;
  float fStack_c60;
  float fStack_c5c;
  float local_c58;
  float fStack_c54;
  float fStack_c50;
  float fStack_c4c;
  undefined8 local_c48;
  undefined8 uStack_c40;
  undefined1 local_c38 [8];
  float fStack_c30;
  float local_c28;
  float fStack_c24;
  float fStack_c20;
  float fStack_c1c;
  float local_c18;
  float fStack_c14;
  float fStack_c10;
  float fStack_c0c;
  undefined8 local_c08;
  undefined8 uStack_c00;
  undefined1 (*local_bf0) [16];
  RTCFilterFunctionNArguments args;
  float local_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float local_b68;
  float fStack_b64;
  float fStack_b60;
  float fStack_b5c;
  float local_b58;
  float fStack_b54;
  float fStack_b50;
  float fStack_b4c;
  float local_b48;
  float fStack_b44;
  float fStack_b40;
  float fStack_b3c;
  float fStack_b2c;
  float fStack_b1c;
  float local_b18;
  float fStack_b14;
  float fStack_b10;
  float fStack_b0c;
  undefined1 local_a98 [16];
  undefined1 local_a88 [16];
  undefined1 local_a78 [8];
  float fStack_a70;
  float fStack_a6c;
  undefined1 local_a68 [16];
  undefined1 local_a58 [16];
  undefined1 local_a48 [16];
  undefined1 local_a38 [16];
  undefined1 local_a28 [16];
  undefined1 local_a18 [16];
  undefined1 local_a08 [16];
  undefined4 local_9f8;
  undefined4 uStack_9f4;
  undefined4 uStack_9f0;
  undefined4 uStack_9ec;
  undefined1 local_9e8 [16];
  undefined1 local_9d8 [16];
  uint local_9c8;
  uint uStack_9c4;
  uint uStack_9c0;
  uint uStack_9bc;
  uint local_9b8;
  uint uStack_9b4;
  uint uStack_9b0;
  uint uStack_9ac;
  uint local_9a8;
  uint uStack_9a4;
  uint uStack_9a0;
  uint uStack_99c;
  undefined1 local_998 [16];
  undefined1 local_988 [16];
  float local_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float local_968;
  float fStack_964;
  float fStack_960;
  float fStack_95c;
  float local_958;
  float fStack_954;
  float fStack_950;
  float fStack_94c;
  float local_948;
  float fStack_944;
  float fStack_940;
  float fStack_93c;
  float local_938;
  float fStack_934;
  float fStack_930;
  float fStack_92c;
  float local_928;
  float fStack_924;
  float fStack_920;
  float fStack_91c;
  float local_918;
  float fStack_914;
  float fStack_910;
  float fStack_90c;
  float local_908;
  float fStack_904;
  float fStack_900;
  float fStack_8fc;
  float local_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float local_8e8;
  float fStack_8e4;
  float fStack_8e0;
  float fStack_8dc;
  undefined8 local_8d8;
  undefined8 uStack_8d0;
  undefined8 local_8c8;
  undefined8 uStack_8c0;
  float local_8b8;
  float fStack_8b4;
  float fStack_8b0;
  float fStack_8ac;
  float local_8a8;
  float fStack_8a4;
  float fStack_8a0;
  float fStack_89c;
  float local_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  undefined1 local_888 [16];
  undefined1 local_878 [16];
  float local_868;
  float fStack_864;
  float fStack_860;
  float fStack_85c;
  float local_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float local_848;
  float fStack_844;
  float fStack_840;
  float fStack_83c;
  float local_838;
  float fStack_834;
  float fStack_830;
  float fStack_82c;
  float local_828;
  float fStack_824;
  float fStack_820;
  float fStack_81c;
  float local_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float local_808;
  float fStack_804;
  float fStack_800;
  float fStack_7fc;
  float local_7f8;
  float fStack_7f4;
  float fStack_7f0;
  float fStack_7ec;
  undefined8 local_7e8;
  undefined8 uStack_7e0;
  NodeRef stack [244];
  
  stack[0] = root;
  local_8f8 = *(float *)((long)&(tray->org).field_0 + k * 4);
  local_908 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x10);
  local_918 = *(float *)((long)&(tray->org).field_0 + k * 4 + 0x20);
  local_928 = *(float *)((long)&(tray->rdir).field_0 + k * 4);
  local_938 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x10);
  local_948 = *(float *)((long)&(tray->rdir).field_0 + k * 4 + 0x20);
  local_968 = local_928 * 0.99999964;
  local_978 = local_938 * 0.99999964;
  local_958 = local_948 * 0.99999964;
  local_928 = local_928 * 1.0000004;
  local_938 = local_938 * 1.0000004;
  local_948 = local_948 * 1.0000004;
  uVar68 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4);
  uVar59 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x10);
  uVar71 = (ulong)*(int *)((long)&(tray->nearXYZ).field_0 + k * 4 + 0x20);
  iVar61 = (tray->tnear).field_0.i[k];
  local_988._4_4_ = iVar61;
  local_988._0_4_ = iVar61;
  local_988._8_4_ = iVar61;
  local_988._12_4_ = iVar61;
  iVar61 = (tray->tfar).field_0.i[k];
  local_998._4_4_ = iVar61;
  local_998._0_4_ = iVar61;
  local_998._8_4_ = iVar61;
  local_998._12_4_ = iVar61;
  local_7e8 = mm_lookupmask_ps._0_8_;
  uStack_7e0 = mm_lookupmask_ps._8_8_;
  local_888 = mm_lookupmask_ps._240_16_;
  pauVar57 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((byte)k & 0x1f)) * 0x10);
  local_cf0 = stack + 1;
  fStack_904 = local_908;
  fStack_900 = local_908;
  fStack_8fc = local_908;
  fStack_944 = local_948;
  fStack_940 = local_948;
  fStack_93c = local_948;
  fStack_974 = local_978;
  fStack_970 = local_978;
  fStack_96c = local_978;
  fStack_8f4 = local_8f8;
  fStack_8f0 = local_8f8;
  fStack_8ec = local_8f8;
  fStack_914 = local_918;
  fStack_910 = local_918;
  fStack_90c = local_918;
  fStack_924 = local_928;
  fStack_920 = local_928;
  fStack_91c = local_928;
  fStack_934 = local_938;
  fStack_930 = local_938;
  fStack_92c = local_938;
  fStack_954 = local_958;
  fStack_950 = local_958;
  fStack_94c = local_958;
  fStack_964 = local_968;
  fStack_960 = local_968;
  fStack_95c = local_968;
  local_bf0 = pauVar57;
LAB_0071f61a:
  do {
    pNVar65 = local_cf0;
    if (pNVar65 == stack) {
LAB_00720fad:
      return pNVar65 != stack;
    }
    local_cf0 = pNVar65 + -1;
    sVar70 = pNVar65[-1].ptr;
    while ((sVar70 & 8) == 0) {
      uVar50 = sVar70 & 0xfffffffffffffff0;
      fVar72 = *(float *)(ray + k * 4 + 0x70);
      pfVar23 = (float *)(uVar50 + 0x80 + uVar68);
      pfVar22 = (float *)(uVar50 + 0x20 + uVar68);
      auVar92._0_4_ = ((*pfVar23 * fVar72 + *pfVar22) - local_8f8) * local_968;
      auVar92._4_4_ = ((pfVar23[1] * fVar72 + pfVar22[1]) - fStack_8f4) * fStack_964;
      auVar92._8_4_ = ((pfVar23[2] * fVar72 + pfVar22[2]) - fStack_8f0) * fStack_960;
      auVar92._12_4_ = ((pfVar23[3] * fVar72 + pfVar22[3]) - fStack_8ec) * fStack_95c;
      auVar92 = maxps(local_988,auVar92);
      pfVar23 = (float *)(uVar50 + 0x80 + uVar59);
      pfVar22 = (float *)(uVar50 + 0x20 + uVar59);
      auVar107._0_4_ = ((*pfVar23 * fVar72 + *pfVar22) - local_908) * local_978;
      auVar107._4_4_ = ((pfVar23[1] * fVar72 + pfVar22[1]) - fStack_904) * fStack_974;
      auVar107._8_4_ = ((pfVar23[2] * fVar72 + pfVar22[2]) - fStack_900) * fStack_970;
      auVar107._12_4_ = ((pfVar23[3] * fVar72 + pfVar22[3]) - fStack_8fc) * fStack_96c;
      pfVar23 = (float *)(uVar50 + 0x80 + uVar71);
      pfVar22 = (float *)(uVar50 + 0x20 + uVar71);
      auVar120._0_4_ = ((*pfVar23 * fVar72 + *pfVar22) - local_918) * local_958;
      auVar120._4_4_ = ((pfVar23[1] * fVar72 + pfVar22[1]) - fStack_914) * fStack_954;
      auVar120._8_4_ = ((pfVar23[2] * fVar72 + pfVar22[2]) - fStack_910) * fStack_950;
      auVar120._12_4_ = ((pfVar23[3] * fVar72 + pfVar22[3]) - fStack_90c) * fStack_94c;
      auVar107 = maxps(auVar107,auVar120);
      auVar92 = maxps(auVar92,auVar107);
      pfVar23 = (float *)(uVar50 + 0x80 + (uVar68 ^ 0x10));
      pfVar22 = (float *)(uVar50 + 0x20 + (uVar68 ^ 0x10));
      auVar118._0_4_ = ((*pfVar23 * fVar72 + *pfVar22) - local_8f8) * local_928;
      auVar118._4_4_ = ((pfVar23[1] * fVar72 + pfVar22[1]) - fStack_8f4) * fStack_924;
      auVar118._8_4_ = ((pfVar23[2] * fVar72 + pfVar22[2]) - fStack_8f0) * fStack_920;
      auVar118._12_4_ = ((pfVar23[3] * fVar72 + pfVar22[3]) - fStack_8ec) * fStack_91c;
      auVar107 = minps(local_998,auVar118);
      pfVar23 = (float *)(uVar50 + 0x80 + (uVar59 ^ 0x10));
      pfVar22 = (float *)(uVar50 + 0x20 + (uVar59 ^ 0x10));
      auVar119._0_4_ = ((*pfVar23 * fVar72 + *pfVar22) - local_908) * local_938;
      auVar119._4_4_ = ((pfVar23[1] * fVar72 + pfVar22[1]) - fStack_904) * fStack_934;
      auVar119._8_4_ = ((pfVar23[2] * fVar72 + pfVar22[2]) - fStack_900) * fStack_930;
      auVar119._12_4_ = ((pfVar23[3] * fVar72 + pfVar22[3]) - fStack_8fc) * fStack_92c;
      pfVar23 = (float *)(uVar50 + 0x80 + (uVar71 ^ 0x10));
      pfVar22 = (float *)(uVar50 + 0x20 + (uVar71 ^ 0x10));
      auVar125._0_4_ = ((*pfVar23 * fVar72 + *pfVar22) - local_918) * local_948;
      auVar125._4_4_ = ((pfVar23[1] * fVar72 + pfVar22[1]) - fStack_914) * fStack_944;
      auVar125._8_4_ = ((pfVar23[2] * fVar72 + pfVar22[2]) - fStack_910) * fStack_940;
      auVar125._12_4_ = ((pfVar23[3] * fVar72 + pfVar22[3]) - fStack_90c) * fStack_93c;
      auVar120 = minps(auVar119,auVar125);
      auVar107 = minps(auVar107,auVar120);
      bVar36 = auVar92._0_4_ <= auVar107._0_4_;
      bVar37 = auVar92._4_4_ <= auVar107._4_4_;
      bVar38 = auVar92._8_4_ <= auVar107._8_4_;
      bVar39 = auVar92._12_4_ <= auVar107._12_4_;
      if (((uint)sVar70 & 7) == 6) {
        bVar36 = (fVar72 < *(float *)(uVar50 + 0xf0) && *(float *)(uVar50 + 0xe0) <= fVar72) &&
                 bVar36;
        bVar37 = (fVar72 < *(float *)(uVar50 + 0xf4) && *(float *)(uVar50 + 0xe4) <= fVar72) &&
                 bVar37;
        bVar38 = (fVar72 < *(float *)(uVar50 + 0xf8) && *(float *)(uVar50 + 0xe8) <= fVar72) &&
                 bVar38;
        bVar39 = (fVar72 < *(float *)(uVar50 + 0xfc) && *(float *)(uVar50 + 0xec) <= fVar72) &&
                 bVar39;
      }
      auVar93._0_4_ = (uint)bVar36 * -0x80000000;
      auVar93._4_4_ = (uint)bVar37 * -0x80000000;
      auVar93._8_4_ = (uint)bVar38 * -0x80000000;
      auVar93._12_4_ = (uint)bVar39 * -0x80000000;
      uVar56 = movmskps((int)pauVar57,auVar93);
      pauVar57 = (undefined1 (*) [16])(ulong)uVar56;
      if (uVar56 == 0) goto LAB_0071f61a;
      pauVar57 = (undefined1 (*) [16])(ulong)(byte)uVar56;
      lVar66 = 0;
      if (pauVar57 != (undefined1 (*) [16])0x0) {
        for (; ((byte)uVar56 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
        }
      }
      sVar70 = *(size_t *)(uVar50 + lVar66 * 8);
      uVar56 = (uVar56 & 0xff) - 1 & uVar56 & 0xff;
      pauVar62 = (undefined1 (*) [16])(ulong)uVar56;
      if (uVar56 != 0) {
        do {
          pauVar57 = pauVar62;
          local_cf0->ptr = sVar70;
          local_cf0 = local_cf0 + 1;
          lVar66 = 0;
          if (pauVar57 != (undefined1 (*) [16])0x0) {
            for (; ((ulong)pauVar57 >> lVar66 & 1) == 0; lVar66 = lVar66 + 1) {
            }
          }
          sVar70 = *(size_t *)(uVar50 + lVar66 * 8);
          pauVar62 = (undefined1 (*) [16])((ulong)(pauVar57[-1] + 0xf) & (ulong)pauVar57);
        } while (pauVar62 != (undefined1 (*) [16])0x0);
      }
    }
    uVar50 = sVar70 & 0xfffffffffffffff0;
    for (pauVar57 = (undefined1 (*) [16])0x0;
        pauVar57 != (undefined1 (*) [16])((ulong)((uint)sVar70 & 0xf) - 8);
        pauVar57 = (undefined1 (*) [16])(*pauVar57 + 1)) {
      lVar66 = (long)pauVar57 * 0x60;
      pSVar64 = context->scene;
      pRVar26 = (pSVar64->geometries).items;
      pGVar27 = pRVar26[*(uint *)(uVar50 + 0x40 + lVar66)].ptr;
      fVar72 = (pGVar27->time_range).lower;
      local_898 = ((*(float *)(ray + k * 4 + 0x70) - fVar72) /
                  ((pGVar27->time_range).upper - fVar72)) * pGVar27->fnumTimeSegments;
      auVar94 = roundss(ZEXT416((uint)fVar72),ZEXT416((uint)local_898),9);
      fVar72 = pGVar27->fnumTimeSegments + -1.0;
      if (fVar72 <= auVar94._0_4_) {
        auVar94._0_4_ = fVar72;
      }
      fVar72 = 0.0;
      if (0.0 <= auVar94._0_4_) {
        fVar72 = auVar94._0_4_;
      }
      local_898 = local_898 - fVar72;
      lVar67 = (long)(int)fVar72 * 0x38;
      lVar28 = *(long *)(*(long *)&pGVar27[2].numPrimitives + lVar67);
      uVar69 = (ulong)*(uint *)(uVar50 + 4 + lVar66);
      lVar1 = lVar28 + (ulong)*(uint *)(uVar50 + lVar66) * 4;
      uVar52 = (ulong)*(uint *)(uVar50 + 0x10 + lVar66);
      pfVar22 = (float *)(lVar28 + uVar52 * 4);
      uVar53 = (ulong)*(uint *)(uVar50 + 0x30 + lVar66);
      pfVar23 = (float *)(lVar28 + uVar53 * 4);
      lVar29 = *(long *)&pRVar26[*(uint *)(uVar50 + 0x44 + lVar66)].ptr[2].numPrimitives;
      lVar30 = *(long *)(lVar29 + lVar67);
      lVar2 = lVar30 + uVar69 * 4;
      uVar56 = *(uint *)(uVar50 + 0x14 + lVar66);
      pfVar3 = (float *)(lVar30 + (ulong)uVar56 * 4);
      lVar51 = (long)((int)fVar72 + 1) * 0x38;
      lVar31 = *(long *)(*(long *)&pGVar27[2].numPrimitives + lVar51);
      pfVar4 = (float *)(lVar31 + (ulong)*(uint *)(uVar50 + lVar66) * 4);
      pfVar5 = (float *)(lVar30 + (ulong)*(uint *)(uVar50 + 0x34 + lVar66) * 4);
      lVar32 = *(long *)&pRVar26[*(uint *)(uVar50 + 0x48 + lVar66)].ptr[2].numPrimitives;
      puVar6 = (undefined8 *)(lVar31 + uVar52 * 4);
      uVar45 = *puVar6;
      uVar46 = puVar6[1];
      lVar33 = *(long *)(lVar32 + lVar67);
      lVar29 = *(long *)(lVar29 + lVar51);
      pfVar7 = (float *)(lVar29 + uVar69 * 4);
      uVar54 = (ulong)*(uint *)(uVar50 + 8 + lVar66);
      lVar32 = *(long *)(lVar32 + lVar51);
      pfVar8 = (float *)(lVar32 + uVar54 * 4);
      uVar63 = (ulong)*(uint *)(uVar50 + 0x18 + lVar66);
      pfVar9 = (float *)(lVar33 + uVar63 * 4);
      lVar34 = *(long *)&pRVar26[*(uint *)(uVar50 + 0x4c + lVar66)].ptr[2].numPrimitives;
      uVar69 = *(ulong *)(lVar34 + lVar67);
      lVar34 = *(long *)(lVar34 + lVar51);
      uVar60 = (ulong)*(uint *)(uVar50 + 0x38 + lVar66);
      pfVar10 = (float *)(lVar33 + uVar60 * 4);
      uVar52 = (ulong)*(uint *)(uVar50 + 0xc + lVar66);
      uVar55 = (ulong)*(uint *)(uVar50 + 0x1c + lVar66);
      pfVar11 = (float *)(uVar69 + uVar55 * 4);
      uVar58 = (ulong)*(uint *)(uVar50 + 0x3c + lVar66);
      pfVar12 = (float *)(uVar69 + uVar58 * 4);
      pfVar13 = (float *)(lVar34 + uVar52 * 4);
      local_c98 = CONCAT44(pfVar12[2],pfVar10[2]);
      pfVar14 = (float *)(lVar32 + uVar63 * 4);
      local_d38 = (float)uVar45;
      fStack_d34 = (float)((ulong)uVar45 >> 0x20);
      fStack_d30 = (float)uVar46;
      pfVar15 = (float *)(lVar29 + (ulong)uVar56 * 4);
      pfVar16 = (float *)(lVar34 + uVar55 * 4);
      pfVar17 = (float *)(lVar31 + uVar53 * 4);
      pfVar18 = (float *)(lVar32 + uVar60 * 4);
      pfVar19 = (float *)(lVar29 + local_c98 * 4);
      pfVar20 = (float *)(lVar34 + uVar58 * 4);
      local_8b8 = 1.0 - local_898;
      local_8a8 = *pfVar22 * local_8b8 + local_d38 * local_898;
      fStack_8a4 = *pfVar3 * local_8b8 + *pfVar15 * local_898;
      fStack_8a0 = *pfVar9 * local_8b8 + *pfVar14 * local_898;
      fStack_89c = *pfVar11 * local_8b8 + *pfVar16 * local_898;
      fStack_d2c = (float)((ulong)uVar46 >> 0x20);
      fVar137 = pfVar22[1] * local_8b8 + fStack_d34 * local_898;
      fVar138 = pfVar3[1] * local_8b8 + pfVar15[1] * local_898;
      fVar139 = pfVar9[1] * local_8b8 + pfVar14[1] * local_898;
      fVar140 = pfVar11[1] * local_8b8 + pfVar16[1] * local_898;
      fVar153 = pfVar22[2] * local_8b8 + fStack_d30 * local_898;
      fVar157 = pfVar3[2] * local_8b8 + pfVar15[2] * local_898;
      fVar160 = pfVar9[2] * local_8b8 + fStack_d30 * local_898;
      fVar163 = pfVar11[2] * local_8b8 + fStack_d2c * local_898;
      fStack_894 = local_898;
      fStack_890 = local_898;
      fStack_88c = local_898;
      fVar73 = *pfVar23 * local_8b8 + *pfVar17 * local_898;
      fVar86 = *pfVar5 * local_8b8 + *pfVar19 * local_898;
      fVar88 = *pfVar10 * local_8b8 + *pfVar18 * local_898;
      fVar90 = *pfVar12 * local_8b8 + *pfVar20 * local_898;
      local_8e8 = pfVar23[1] * local_8b8 + pfVar17[1] * local_898;
      fStack_8e4 = pfVar5[1] * local_8b8 + pfVar19[1] * local_898;
      fStack_8e0 = pfVar10[1] * local_8b8 + pfVar18[1] * local_898;
      fStack_8dc = pfVar12[1] * local_8b8 + pfVar20[1] * local_898;
      fStack_8b4 = local_8b8;
      fStack_8b0 = local_8b8;
      fStack_8ac = local_8b8;
      fVar124 = pfVar23[2] * local_8b8 + pfVar17[2] * local_898;
      fVar129 = pfVar5[2] * local_8b8 + pfVar19[2] * local_898;
      fVar130 = fStack_ca0 * local_8b8 + pfVar18[2] * local_898;
      fVar131 = fStack_c9c * local_8b8 + pfVar20[2] * local_898;
      fVar72 = *(float *)(ray + k * 4);
      fStack_b2c = *(float *)(ray + k * 4 + 0x10);
      fStack_b1c = *(float *)(ray + k * 4 + 0x20);
      fVar117 = (pfVar14[2] * local_8b8 + *pfVar4 * local_898) - fVar72;
      fVar123 = (pfVar16[2] * local_8b8 + *pfVar7 * local_898) - fVar72;
      fStack_d20 = (fStack_d20 * local_8b8 + *pfVar8 * local_898) - fVar72;
      fStack_d1c = (fStack_d1c * local_8b8 + *pfVar13 * local_898) - fVar72;
      local_7f8 = (*(float *)(lVar1 + 4) * local_8b8 + pfVar4[1] * local_898) - fStack_b2c;
      fStack_7f4 = (*(float *)(lVar2 + 4) * local_8b8 + pfVar7[1] * local_898) - fStack_b2c;
      fStack_7f0 = (*(float *)(lVar33 + uVar54 * 4 + 4) * local_8b8 + pfVar8[1] * local_898) -
                   fStack_b2c;
      fStack_7ec = (*(float *)(uVar69 + uVar52 * 4 + 4) * local_8b8 + pfVar13[1] * local_898) -
                   fStack_b2c;
      fVar154 = (*(float *)(lVar1 + 8) * local_8b8 + pfVar4[2] * local_898) - fStack_b1c;
      fVar158 = (*(float *)(lVar2 + 8) * local_8b8 + pfVar7[2] * local_898) - fStack_b1c;
      fVar161 = (fStack_d00 * local_8b8 + pfVar8[2] * local_898) - fStack_b1c;
      fVar164 = (fStack_cfc * local_8b8 + pfVar13[2] * local_898) - fStack_b1c;
      fVar169 = local_8a8 - fVar72;
      fVar171 = fStack_8a4 - fVar72;
      fVar173 = fStack_8a0 - fVar72;
      fVar174 = fStack_89c - fVar72;
      fVar149 = fVar73 - fVar72;
      fVar151 = fVar86 - fVar72;
      fVar152 = fVar88 - fVar72;
      fVar72 = fVar90 - fVar72;
      local_b18 = local_8e8 - fStack_b2c;
      fStack_b14 = fStack_8e4 - fStack_b2c;
      fStack_b10 = fStack_8e0 - fStack_b2c;
      fStack_b0c = fStack_8dc - fStack_b2c;
      local_c98._0_4_ = fVar124 - fStack_b1c;
      local_c98._4_4_ = fVar129 - fStack_b1c;
      fStack_c90 = fVar130 - fStack_b1c;
      fStack_c8c = fVar131 - fStack_b1c;
      local_808 = fVar149 - fVar117;
      fStack_804 = fVar151 - fVar123;
      fStack_800 = fVar152 - fStack_d20;
      fStack_7fc = fVar72 - fStack_d1c;
      local_828 = local_b18 - local_7f8;
      fStack_824 = fStack_b14 - fStack_7f4;
      fStack_820 = fStack_b10 - fStack_7f0;
      fStack_81c = fStack_b0c - fStack_7ec;
      local_818 = (float)local_c98 - fVar154;
      fStack_814 = local_c98._4_4_ - fVar158;
      fStack_810 = fStack_c90 - fVar161;
      fStack_80c = fStack_c8c - fVar164;
      fStack_c50 = *(float *)(ray + k * 4 + 0x50);
      fVar183 = *(float *)(ray + k * 4 + 0x60);
      local_c68 = *(float *)(ray + k * 4 + 0x40);
      fVar155 = (local_828 * ((float)local_c98 + fVar154) - (local_b18 + local_7f8) * local_818) *
                local_c68 +
                ((fVar149 + fVar117) * local_818 - ((float)local_c98 + fVar154) * local_808) *
                fStack_c50 +
                (local_808 * (local_b18 + local_7f8) - (fVar149 + fVar117) * local_828) * fVar183;
      fVar159 = (fStack_824 * (local_c98._4_4_ + fVar158) - (fStack_b14 + fStack_7f4) * fStack_814)
                * local_c68 +
                ((fVar151 + fVar123) * fStack_814 - (local_c98._4_4_ + fVar158) * fStack_804) *
                fStack_c50 +
                (fStack_804 * (fStack_b14 + fStack_7f4) - (fVar151 + fVar123) * fStack_824) *
                fVar183;
      fVar162 = (fStack_820 * (fStack_c90 + fVar161) - (fStack_b10 + fStack_7f0) * fStack_810) *
                local_c68 +
                ((fVar152 + fStack_d20) * fStack_810 - (fStack_c90 + fVar161) * fStack_800) *
                fStack_c50 +
                (fStack_800 * (fStack_b10 + fStack_7f0) - (fVar152 + fStack_d20) * fStack_820) *
                fVar183;
      fVar165 = (fStack_81c * (fStack_c8c + fVar164) - (fStack_b0c + fStack_7ec) * fStack_80c) *
                local_c68 +
                ((fVar72 + fStack_d1c) * fStack_80c - (fStack_c8c + fVar164) * fStack_7fc) *
                fStack_c50 +
                (fStack_7fc * (fStack_b0c + fStack_7ec) - (fVar72 + fStack_d1c) * fStack_81c) *
                fVar183;
      local_b78 = fVar137 - fStack_b2c;
      fStack_b74 = fVar138 - fStack_b2c;
      fStack_b70 = fVar139 - fStack_b2c;
      fStack_b6c = fVar140 - fStack_b2c;
      local_b68 = fVar153 - fStack_b1c;
      fStack_b64 = fVar157 - fStack_b1c;
      fStack_b60 = fVar160 - fStack_b1c;
      fStack_b5c = fVar163 - fStack_b1c;
      local_848 = fVar117 - fVar169;
      fStack_844 = fVar123 - fVar171;
      fStack_840 = fStack_d20 - fVar173;
      fStack_83c = fStack_d1c - fVar174;
      fVar74 = local_7f8 - local_b78;
      fVar87 = fStack_7f4 - fStack_b74;
      fVar89 = fStack_7f0 - fStack_b70;
      fVar91 = fStack_7ec - fStack_b6c;
      local_838 = fVar154 - local_b68;
      fStack_834 = fVar158 - fStack_b64;
      fStack_830 = fVar161 - fStack_b60;
      fStack_82c = fVar164 - fStack_b5c;
      local_878._0_4_ =
           (fVar74 * (fVar154 + local_b68) - (local_7f8 + local_b78) * local_838) * local_c68 +
           ((fVar117 + fVar169) * local_838 - (fVar154 + local_b68) * local_848) * fStack_c50 +
           (local_848 * (local_7f8 + local_b78) - (fVar117 + fVar169) * fVar74) * fVar183;
      local_878._4_4_ =
           (fVar87 * (fVar158 + fStack_b64) - (fStack_7f4 + fStack_b74) * fStack_834) * local_c68 +
           ((fVar123 + fVar171) * fStack_834 - (fVar158 + fStack_b64) * fStack_844) * fStack_c50 +
           (fStack_844 * (fStack_7f4 + fStack_b74) - (fVar123 + fVar171) * fVar87) * fVar183;
      local_878._8_4_ =
           (fVar89 * (fVar161 + fStack_b60) - (fStack_7f0 + fStack_b70) * fStack_830) * local_c68 +
           ((fStack_d20 + fVar173) * fStack_830 - (fVar161 + fStack_b60) * fStack_840) * fStack_c50
           + (fStack_840 * (fStack_7f0 + fStack_b70) - (fStack_d20 + fVar173) * fVar89) * fVar183;
      local_878._12_4_ =
           (fVar91 * (fVar164 + fStack_b5c) - (fStack_7ec + fStack_b6c) * fStack_82c) * local_c68 +
           ((fStack_d1c + fVar174) * fStack_82c - (fVar164 + fStack_b5c) * fStack_83c) * fStack_c50
           + (fStack_83c * (fStack_7ec + fStack_b6c) - (fStack_d1c + fVar174) * fVar91) * fVar183;
      fVar132 = fVar169 - fVar149;
      fVar134 = fVar171 - fVar151;
      fVar135 = fVar173 - fVar152;
      fVar136 = fVar174 - fVar72;
      fVar141 = local_b78 - local_b18;
      fVar144 = fStack_b74 - fStack_b14;
      fVar145 = fStack_b70 - fStack_b10;
      fVar146 = fStack_b6c - fStack_b0c;
      fVar176 = local_b68 - (float)local_c98;
      fVar178 = fStack_b64 - local_c98._4_4_;
      fVar180 = fStack_b60 - fStack_c90;
      fVar182 = fStack_b5c - fStack_c8c;
      local_b58 = local_b78 + local_b18;
      fStack_b54 = fStack_b74 + fStack_b14;
      fStack_b50 = fStack_b70 + fStack_b10;
      fStack_b4c = fStack_b6c + fStack_b0c;
      local_b48 = local_b68 + (float)local_c98;
      fStack_b44 = fStack_b64 + local_c98._4_4_;
      fStack_b40 = fStack_b60 + fStack_c90;
      fStack_b3c = fStack_b5c + fStack_c8c;
      _local_c58 = CONCAT44(fStack_c50,fStack_c50);
      auVar95._0_4_ =
           (fVar141 * local_b48 - local_b58 * fVar176) * local_c68 +
           ((fVar149 + fVar169) * fVar176 - fVar132 * local_b48) * fStack_c50 +
           (fVar132 * local_b58 - (fVar149 + fVar169) * fVar141) * fVar183;
      auVar95._4_4_ =
           (fVar144 * fStack_b44 - fStack_b54 * fVar178) * local_c68 +
           ((fVar151 + fVar171) * fVar178 - fVar134 * fStack_b44) * fStack_c50 +
           (fVar134 * fStack_b54 - (fVar151 + fVar171) * fVar144) * fVar183;
      auVar95._8_4_ =
           (fVar145 * fStack_b40 - fStack_b50 * fVar180) * local_c68 +
           ((fVar152 + fVar173) * fVar180 - fVar135 * fStack_b40) * fStack_c50 +
           (fVar135 * fStack_b50 - (fVar152 + fVar173) * fVar145) * fVar183;
      auVar95._12_4_ =
           (fVar146 * fStack_b3c - fStack_b4c * fVar182) * local_c68 +
           ((fVar72 + fVar174) * fVar182 - fVar136 * fStack_b3c) * fStack_c50 +
           (fVar136 * fStack_b4c - (fVar72 + fVar174) * fVar146) * fVar183;
      fVar169 = fVar155 + local_878._0_4_ + auVar95._0_4_;
      fVar171 = fVar159 + local_878._4_4_ + auVar95._4_4_;
      fVar173 = fVar162 + local_878._8_4_ + auVar95._8_4_;
      fVar174 = fVar165 + local_878._12_4_ + auVar95._12_4_;
      auVar75._8_4_ = fVar162;
      auVar75._0_8_ = CONCAT44(fVar159,fVar155);
      auVar75._12_4_ = fVar165;
      auVar92 = minps(auVar75,local_878);
      auVar92 = minps(auVar92,auVar95);
      auVar126._8_4_ = fVar162;
      auVar126._0_8_ = CONCAT44(fVar159,fVar155);
      auVar126._12_4_ = fVar165;
      auVar107 = maxps(auVar126,local_878);
      auVar107 = maxps(auVar107,auVar95);
      uVar106 = (uint)DAT_01f46710;
      uVar114 = DAT_01f46710._4_4_;
      uVar115 = DAT_01f46710._8_4_;
      uVar116 = DAT_01f46710._12_4_;
      fVar72 = (float)((uint)fVar169 & uVar106) * 1.1920929e-07;
      fVar149 = (float)((uint)fVar171 & uVar114) * 1.1920929e-07;
      fVar151 = (float)((uint)fVar173 & uVar115) * 1.1920929e-07;
      fVar152 = (float)((uint)fVar174 & uVar116) * 1.1920929e-07;
      auVar127._4_4_ = -(uint)(auVar107._4_4_ <= fVar149);
      auVar127._0_4_ = -(uint)(auVar107._0_4_ <= fVar72);
      auVar127._8_4_ = -(uint)(auVar107._8_4_ <= fVar151);
      auVar127._12_4_ = -(uint)(auVar107._12_4_ <= fVar152);
      auVar76._4_4_ = -(uint)(-fVar149 <= auVar92._4_4_);
      auVar76._0_4_ = -(uint)(-fVar72 <= auVar92._0_4_);
      auVar76._8_4_ = -(uint)(-fVar151 <= auVar92._8_4_);
      auVar76._12_4_ = -(uint)(-fVar152 <= auVar92._12_4_);
      auVar127 = auVar127 | auVar76;
      lVar1 = uVar50 + lVar66;
      uVar52 = (ulong)*(uint *)(uVar50 + 0x20 + lVar66);
      uVar55 = (ulong)*(uint *)(uVar50 + 0x24 + lVar66);
      uVar53 = (ulong)*(uint *)(uVar50 + 0x28 + lVar66);
      uVar54 = (ulong)*(uint *)(uVar50 + 0x2c + lVar66);
      iVar61 = movmskps(uVar56,auVar127);
      puVar6 = (undefined8 *)(lVar28 + uVar52 * 4);
      uVar45 = *puVar6;
      _local_c38 = *(undefined1 (*) [16])(lVar31 + uVar52 * 4);
      puVar21 = (undefined8 *)(lVar30 + uVar55 * 4);
      local_8c8 = *puVar21;
      uStack_8c0 = puVar21[1];
      puVar21 = (undefined8 *)(lVar29 + uVar55 * 4);
      local_c48 = *puVar21;
      uStack_c40 = puVar21[1];
      puVar21 = (undefined8 *)(lVar33 + uVar53 * 4);
      local_8d8 = *puVar21;
      uStack_8d0 = puVar21[1];
      puVar21 = (undefined8 *)(lVar32 + uVar53 * 4);
      uVar46 = *puVar21;
      uVar47 = puVar21[1];
      local_c18 = (float)uVar46;
      fStack_c14 = (float)((ulong)uVar46 >> 0x20);
      fStack_c10 = (float)uVar47;
      fStack_c0c = (float)((ulong)uVar47 >> 0x20);
      puVar21 = (undefined8 *)(uVar69 + uVar54 * 4);
      uVar46 = *puVar21;
      uVar47 = puVar21[1];
      local_c28 = (float)uVar46;
      fStack_c24 = (float)((ulong)uVar46 >> 0x20);
      fStack_c20 = (float)uVar47;
      fStack_c1c = (float)((ulong)uVar47 >> 0x20);
      puVar21 = (undefined8 *)(lVar34 + uVar54 * 4);
      local_c08 = *puVar21;
      uStack_c00 = puVar21[1];
      local_cc8 = (float)uVar45;
      fStack_cc4 = (float)((ulong)uVar45 >> 0x20);
      fStack_cc0 = (float)puVar6[1];
      auVar92 = _DAT_01f46710;
      scene = pSVar64;
      fStack_c5c = local_c68;
      if (iVar61 == 0) {
LAB_007205e8:
        uVar56 = (uint)uVar69;
      }
      else {
        local_858 = fVar141;
        fStack_854 = fVar144;
        fStack_850 = fVar145;
        fStack_84c = fVar146;
        local_868 = fVar176;
        fStack_864 = fVar178;
        fStack_860 = fVar180;
        fStack_85c = fVar182;
        auVar147._0_4_ = fVar74 * fVar176 - fVar141 * local_838;
        auVar147._4_4_ = fVar87 * fVar178 - fVar144 * fStack_834;
        auVar147._8_4_ = fVar89 * fVar180 - fVar145 * fStack_830;
        auVar147._12_4_ = fVar91 * fVar182 - fVar146 * fStack_82c;
        auVar77._4_4_ =
             -(uint)((float)((uint)(fVar87 * fStack_814) & uVar114) <
                    (float)((uint)(fVar144 * fStack_834) & uVar114));
        auVar77._0_4_ =
             -(uint)((float)((uint)(fVar74 * local_818) & uVar106) <
                    (float)((uint)(fVar141 * local_838) & uVar106));
        auVar77._8_4_ =
             -(uint)((float)((uint)(fVar89 * fStack_810) & uVar115) <
                    (float)((uint)(fVar145 * fStack_830) & uVar115));
        auVar77._12_4_ =
             -(uint)((float)((uint)(fVar91 * fStack_80c) & uVar116) <
                    (float)((uint)(fVar146 * fStack_82c) & uVar116));
        auVar42._4_4_ = fStack_824 * fStack_834 - fVar87 * fStack_814;
        auVar42._0_4_ = local_828 * local_838 - fVar74 * local_818;
        auVar42._8_4_ = fStack_820 * fStack_830 - fVar89 * fStack_810;
        auVar42._12_4_ = fStack_81c * fStack_82c - fVar91 * fStack_80c;
        local_a68 = blendvps(auVar147,auVar42,auVar77);
        auVar142._0_4_ = local_818 * local_848 - local_808 * local_838;
        auVar142._4_4_ = fStack_814 * fStack_844 - fStack_804 * fStack_834;
        auVar142._8_4_ = fStack_810 * fStack_840 - fStack_800 * fStack_830;
        auVar142._12_4_ = fStack_80c * fStack_83c - fStack_7fc * fStack_82c;
        auVar133._0_4_ = fVar132 * local_838 - local_848 * fVar176;
        auVar133._4_4_ = fVar134 * fStack_834 - fStack_844 * fVar178;
        auVar133._8_4_ = fVar135 * fStack_830 - fStack_840 * fVar180;
        auVar133._12_4_ = fVar136 * fStack_82c - fStack_83c * fVar182;
        auVar78._4_4_ =
             -(uint)((float)((uint)(fStack_804 * fStack_834) & uVar114) <
                    (float)((uint)(fStack_844 * fVar178) & uVar114));
        auVar78._0_4_ =
             -(uint)((float)((uint)(local_808 * local_838) & uVar106) <
                    (float)((uint)(local_848 * fVar176) & uVar106));
        auVar78._8_4_ =
             -(uint)((float)((uint)(fStack_800 * fStack_830) & uVar115) <
                    (float)((uint)(fStack_840 * fVar180) & uVar115));
        auVar78._12_4_ =
             -(uint)((float)((uint)(fStack_7fc * fStack_82c) & uVar116) <
                    (float)((uint)(fStack_83c * fVar182) & uVar116));
        local_a58 = blendvps(auVar133,auVar142,auVar78);
        auVar177._0_4_ = local_848 * fVar141 - fVar132 * fVar74;
        auVar177._4_4_ = fStack_844 * fVar144 - fVar134 * fVar87;
        auVar177._8_4_ = fStack_840 * fVar145 - fVar135 * fVar89;
        auVar177._12_4_ = fStack_83c * fVar146 - fVar136 * fVar91;
        auVar79._4_4_ =
             -(uint)((float)((uint)(fStack_844 * fStack_824) & uVar114) <
                    (float)((uint)(fVar134 * fVar87) & uVar114));
        auVar79._0_4_ =
             -(uint)((float)((uint)(local_848 * local_828) & uVar106) <
                    (float)((uint)(fVar132 * fVar74) & uVar106));
        auVar79._8_4_ =
             -(uint)((float)((uint)(fStack_840 * fStack_820) & uVar115) <
                    (float)((uint)(fVar135 * fVar89) & uVar115));
        auVar79._12_4_ =
             -(uint)((float)((uint)(fStack_83c * fStack_81c) & uVar116) <
                    (float)((uint)(fVar136 * fVar91) & uVar116));
        auVar40._4_4_ = fStack_804 * fVar87 - fStack_844 * fStack_824;
        auVar40._0_4_ = local_808 * fVar74 - local_848 * local_828;
        auVar40._8_4_ = fStack_800 * fVar89 - fStack_840 * fStack_820;
        auVar40._12_4_ = fStack_7fc * fVar91 - fStack_83c * fStack_81c;
        local_a48 = blendvps(auVar177,auVar40,auVar79);
        fVar72 = local_c68 * local_a68._0_4_ +
                 fStack_c50 * local_a58._0_4_ + fVar183 * local_a48._0_4_;
        fVar74 = local_c68 * local_a68._4_4_ +
                 fStack_c50 * local_a58._4_4_ + fVar183 * local_a48._4_4_;
        fVar87 = local_c68 * local_a68._8_4_ +
                 fStack_c50 * local_a58._8_4_ + fVar183 * local_a48._8_4_;
        fVar89 = local_c68 * local_a68._12_4_ +
                 fStack_c50 * local_a58._12_4_ + fVar183 * local_a48._12_4_;
        auVar96._0_4_ = fVar72 + fVar72;
        auVar96._4_4_ = fVar74 + fVar74;
        auVar96._8_4_ = fVar87 + fVar87;
        auVar96._12_4_ = fVar89 + fVar89;
        auVar108._0_4_ = local_7f8 * local_a58._0_4_ + fVar154 * local_a48._0_4_;
        auVar108._4_4_ = fStack_7f4 * local_a58._4_4_ + fVar158 * local_a48._4_4_;
        auVar108._8_4_ = fStack_7f0 * local_a58._8_4_ + fVar161 * local_a48._8_4_;
        auVar108._12_4_ = fStack_7ec * local_a58._12_4_ + fVar164 * local_a48._12_4_;
        fVar117 = fVar117 * local_a68._0_4_ + auVar108._0_4_;
        fVar123 = fVar123 * local_a68._4_4_ + auVar108._4_4_;
        fVar132 = fStack_d20 * local_a68._8_4_ + auVar108._8_4_;
        fVar134 = fStack_d1c * local_a68._12_4_ + auVar108._12_4_;
        auVar107 = rcpps(auVar108,auVar96);
        fVar72 = auVar107._0_4_;
        fVar74 = auVar107._4_4_;
        fVar89 = auVar107._8_4_;
        fVar91 = auVar107._12_4_;
        fVar149 = (float)DAT_01f46a60;
        fVar151 = DAT_01f46a60._4_4_;
        fVar152 = DAT_01f46a60._12_4_;
        fVar87 = DAT_01f46a60._8_4_;
        local_a78._0_4_ =
             ((fVar149 - auVar96._0_4_ * fVar72) * fVar72 + fVar72) * (fVar117 + fVar117);
        local_a78._4_4_ =
             ((fVar151 - auVar96._4_4_ * fVar74) * fVar74 + fVar74) * (fVar123 + fVar123);
        fStack_a70 = ((fVar87 - auVar96._8_4_ * fVar89) * fVar89 + fVar89) * (fVar132 + fVar132);
        fStack_a6c = ((fVar152 - auVar96._12_4_ * fVar91) * fVar91 + fVar91) * (fVar134 + fVar134);
        fVar72 = *(float *)(ray + k * 4 + 0x80);
        fVar74 = *(float *)(ray + k * 4 + 0x30);
        auVar109._0_4_ =
             -(uint)(fVar74 <= (float)local_a78._0_4_ && (float)local_a78._0_4_ <= fVar72) &
             auVar127._0_4_;
        auVar109._4_4_ =
             -(uint)(fVar74 <= (float)local_a78._4_4_ && (float)local_a78._4_4_ <= fVar72) &
             auVar127._4_4_;
        auVar109._8_4_ = -(uint)(fStack_a70 <= fVar72 && fVar74 <= fStack_a70) & auVar127._8_4_;
        auVar109._12_4_ = -(uint)(fVar74 <= fStack_a6c && fStack_a6c <= fVar72) & auVar127._12_4_;
        uVar56 = movmskps((int)uVar69,auVar109);
        uVar69 = (ulong)uVar56;
        if (uVar56 == 0) goto LAB_007205e8;
        auVar110._0_4_ = auVar109._0_4_ & -(uint)(auVar96._0_4_ != 0.0);
        auVar110._4_4_ = auVar109._4_4_ & -(uint)(auVar96._4_4_ != 0.0);
        auVar110._8_4_ = auVar109._8_4_ & -(uint)(auVar96._8_4_ != 0.0);
        auVar110._12_4_ = auVar109._12_4_ & -(uint)(auVar96._12_4_ != 0.0);
        uVar56 = movmskps(uVar56,auVar110);
        if (uVar56 != 0) {
          auVar48._4_4_ = fVar171;
          auVar48._0_4_ = fVar169;
          auVar48._8_4_ = fVar173;
          auVar48._12_4_ = fVar174;
          local_a38._8_8_ = uStack_7e0;
          local_a38._0_8_ = local_7e8;
          auVar107 = rcpps(auVar110,auVar48);
          fVar183 = auVar107._0_4_;
          fVar74 = auVar107._4_4_;
          fVar89 = auVar107._8_4_;
          fVar91 = auVar107._12_4_;
          fVar183 = (float)(-(uint)(1e-18 <= (float)((uint)fVar169 & uVar106)) &
                           (uint)((fVar149 - fVar169 * fVar183) * fVar183 + fVar183));
          fVar74 = (float)(-(uint)(1e-18 <= (float)((uint)fVar171 & uVar114)) &
                          (uint)((fVar151 - fVar171 * fVar74) * fVar74 + fVar74));
          fVar89 = (float)(-(uint)(1e-18 <= (float)((uint)fVar173 & uVar115)) &
                          (uint)((fVar87 - fVar173 * fVar89) * fVar89 + fVar89));
          fVar91 = (float)(-(uint)(1e-18 <= (float)((uint)fVar174 & uVar116)) &
                          (uint)((fVar152 - fVar174 * fVar91) * fVar91 + fVar91));
          auVar166._0_4_ = fVar155 * fVar183;
          auVar166._4_4_ = fVar159 * fVar74;
          auVar166._8_4_ = fVar162 * fVar89;
          auVar166._12_4_ = fVar165 * fVar91;
          auVar107 = minps(auVar166,_DAT_01f46a60);
          auVar184._0_4_ = fVar183 * local_878._0_4_;
          auVar184._4_4_ = fVar74 * local_878._4_4_;
          auVar184._8_4_ = fVar89 * local_878._8_4_;
          auVar184._12_4_ = fVar91 * local_878._12_4_;
          auVar120 = minps(auVar184,_DAT_01f46a60);
          auVar97._0_4_ = fVar149 - auVar107._0_4_;
          auVar97._4_4_ = fVar151 - auVar107._4_4_;
          auVar97._8_4_ = fVar87 - auVar107._8_4_;
          auVar97._12_4_ = fVar152 - auVar107._12_4_;
          auVar111._0_4_ = fVar149 - auVar120._0_4_;
          auVar111._4_4_ = fVar151 - auVar120._4_4_;
          auVar111._8_4_ = fVar87 - auVar120._8_4_;
          auVar111._12_4_ = fVar152 - auVar120._12_4_;
          local_a98 = blendvps(auVar107,auVar97,local_a38);
          local_a88 = blendvps(auVar120,auVar111,local_a38);
          uVar69 = (ulong)(byte)uVar56;
          fStack_c64 = local_c68;
          fStack_c60 = local_c68;
          fStack_c4c = fStack_c50;
          do {
            uVar52 = 0;
            if (uVar69 != 0) {
              for (; (uVar69 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
              }
            }
            local_9c8 = *(uint *)(lVar1 + 0x40 + uVar52 * 4);
            pGVar27 = (pSVar64->geometries).items[local_9c8].ptr;
            uVar56 = *(uint *)(ray + k * 4 + 0x90);
            if ((pGVar27->mask & uVar56) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar27->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00720fa1;
              local_9f8 = *(undefined4 *)(local_a98 + uVar52 * 4);
              uVar24 = *(undefined4 *)(local_a88 + uVar52 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a78 + uVar52 * 4);
              args.context = context->user;
              local_9d8._4_4_ = *(undefined4 *)(lVar1 + 0x50 + uVar52 * 4);
              local_9e8._4_4_ = uVar24;
              local_9e8._0_4_ = uVar24;
              local_9e8._8_4_ = uVar24;
              local_9e8._12_4_ = uVar24;
              local_a28._4_4_ = *(undefined4 *)(local_a68 + uVar52 * 4);
              uVar24 = *(undefined4 *)(local_a58 + uVar52 * 4);
              uVar25 = *(undefined4 *)(local_a48 + uVar52 * 4);
              local_a18._4_4_ = uVar24;
              local_a18._0_4_ = uVar24;
              local_a18._8_4_ = uVar24;
              local_a18._12_4_ = uVar24;
              local_a08._4_4_ = uVar25;
              local_a08._0_4_ = uVar25;
              local_a08._8_4_ = uVar25;
              local_a08._12_4_ = uVar25;
              local_a28._0_4_ = local_a28._4_4_;
              local_a28._8_4_ = local_a28._4_4_;
              local_a28._12_4_ = local_a28._4_4_;
              uStack_9f4 = local_9f8;
              uStack_9f0 = local_9f8;
              uStack_9ec = local_9f8;
              local_9d8._0_4_ = local_9d8._4_4_;
              local_9d8._8_4_ = local_9d8._4_4_;
              local_9d8._12_4_ = local_9d8._4_4_;
              uStack_9c4 = local_9c8;
              uStack_9c0 = local_9c8;
              uStack_9bc = local_9c8;
              local_9b8 = (args.context)->instID[0];
              uStack_9b4 = local_9b8;
              uStack_9b0 = local_9b8;
              uStack_9ac = local_9b8;
              local_9a8 = (args.context)->instPrimID[0];
              uStack_9a4 = local_9a8;
              uStack_9a0 = local_9a8;
              uStack_99c = local_9a8;
              local_c88 = *local_bf0;
              args.valid = (int *)local_c88;
              args.geometryUserPtr = pGVar27->userPtr;
              args.hit = (RTCHitN *)local_a28;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar27->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar27->occlusionFilterN)(&args);
                pSVar64 = scene;
                auVar92 = _DAT_01f46710;
              }
              if (local_c88 == (undefined1  [16])0x0) {
                auVar98._8_4_ = 0xffffffff;
                auVar98._0_8_ = 0xffffffffffffffff;
                auVar98._12_4_ = 0xffffffff;
                auVar98 = auVar98 ^ _DAT_01f46b70;
              }
              else {
                p_Var35 = context->args->filter;
                if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar27->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var35)(&args);
                  pSVar64 = scene;
                  auVar92 = _DAT_01f46710;
                }
                auVar80._0_4_ = -(uint)(local_c88._0_4_ == 0);
                auVar80._4_4_ = -(uint)(local_c88._4_4_ == 0);
                auVar80._8_4_ = -(uint)(local_c88._8_4_ == 0);
                auVar80._12_4_ = -(uint)(local_c88._12_4_ == 0);
                auVar98 = auVar80 ^ _DAT_01f46b70;
                auVar107 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar80);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar107;
              }
              uVar56 = (uint)uVar52;
              if ((_DAT_01f46b40 & auVar98) != (undefined1  [16])0x0) goto LAB_00720fa1;
              *(float *)(ray + k * 4 + 0x80) = fVar72;
            }
            uVar69 = uVar69 ^ 1L << (uVar52 & 0x3f);
          } while (uVar69 != 0);
          fStack_b2c = *(float *)(ray + k * 4 + 0x10);
          fStack_b1c = *(float *)(ray + k * 4 + 0x20);
          fStack_c5c = *(float *)(ray + k * 4 + 0x40);
          fStack_c50 = *(float *)(ray + k * 4 + 0x50);
          fVar183 = *(float *)(ray + k * 4 + 0x60);
          local_b18 = local_8e8 - fStack_b2c;
          fStack_b14 = fStack_8e4 - fStack_b2c;
          fStack_b10 = fStack_8e0 - fStack_b2c;
          fStack_b0c = fStack_8dc - fStack_b2c;
          local_c98._0_4_ = fVar124 - fStack_b1c;
          local_c98._4_4_ = fVar129 - fStack_b1c;
          fStack_c90 = fVar130 - fStack_b1c;
          fStack_c8c = fVar131 - fStack_b1c;
          local_b78 = fVar137 - fStack_b2c;
          fStack_b74 = fVar138 - fStack_b2c;
          fStack_b70 = fVar139 - fStack_b2c;
          fStack_b6c = fVar140 - fStack_b2c;
          local_b68 = fVar153 - fStack_b1c;
          fStack_b64 = fVar157 - fStack_b1c;
          fStack_b60 = fVar160 - fStack_b1c;
          fStack_b5c = fVar163 - fStack_b1c;
          local_b58 = local_b18 + local_b78;
          fStack_b54 = fStack_b14 + fStack_b74;
          fStack_b50 = fStack_b10 + fStack_b70;
          fStack_b4c = fStack_b0c + fStack_b6c;
          local_b48 = (float)local_c98 + local_b68;
          fStack_b44 = local_c98._4_4_ + fStack_b64;
          fStack_b40 = fStack_c90 + fStack_b60;
          fStack_b3c = fStack_c8c + fStack_b5c;
        }
      }
      fVar158 = (fStack_cc4 * local_8b8 + (float)local_c38._4_4_ * local_898) - fStack_b2c;
      fVar159 = (local_8c8._4_4_ * fStack_8b4 + local_c48._4_4_ * fStack_894) - fStack_b2c;
      fVar160 = (local_8d8._4_4_ * fStack_8b0 + fStack_c14 * fStack_890) - fStack_b2c;
      fStack_b2c = (fStack_c24 * fStack_8ac + local_c08._4_4_ * fStack_88c) - fStack_b2c;
      fVar131 = (fStack_cc0 * local_8b8 + fStack_c30 * local_898) - fStack_b1c;
      fVar132 = ((float)uStack_8c0 * fStack_8b4 + (float)uStack_c40 * fStack_894) - fStack_b1c;
      fVar134 = ((float)uStack_8d0 * fStack_8b0 + fStack_c10 * fStack_890) - fStack_b1c;
      fStack_b1c = (fStack_c20 * fStack_8ac + (float)uStack_c00 * fStack_88c) - fStack_b1c;
      fVar72 = *(float *)(ray + k * 4);
      fVar174 = (local_cc8 * local_8b8 + (float)local_c38._0_4_ * local_898) - fVar72;
      fVar124 = ((float)local_8c8 * fStack_8b4 + (float)local_c48 * fStack_894) - fVar72;
      fVar129 = ((float)local_8d8 * fStack_8b0 + local_c18 * fStack_890) - fVar72;
      fVar130 = (local_c28 * fStack_8ac + (float)local_c08 * fStack_88c) - fVar72;
      fVar73 = fVar73 - fVar72;
      fVar86 = fVar86 - fVar72;
      fVar88 = fVar88 - fVar72;
      fVar90 = fVar90 - fVar72;
      fVar182 = local_8a8 - fVar72;
      fVar179 = fStack_8a4 - fVar72;
      fVar181 = fStack_8a0 - fVar72;
      fVar72 = fStack_89c - fVar72;
      fVar171 = fVar182 - fVar174;
      fVar173 = fVar179 - fVar124;
      fStack_ca0 = fVar181 - fVar129;
      fStack_c9c = fVar72 - fVar130;
      fVar165 = local_b78 - fVar158;
      fVar176 = fStack_b74 - fVar159;
      fVar178 = fStack_b70 - fVar160;
      fVar180 = fStack_b6c - fStack_b2c;
      fVar141 = local_b68 - fVar131;
      fVar145 = fStack_b64 - fVar132;
      fVar153 = fStack_b60 - fVar134;
      fVar155 = fStack_b5c - fStack_b1c;
      fVar74 = local_b18 - local_b78;
      fVar91 = fStack_b14 - fStack_b74;
      fVar152 = fStack_b10 - fStack_b70;
      fVar169 = fStack_b0c - fStack_b6c;
      fVar87 = (float)local_c98 - local_b68;
      fVar149 = local_c98._4_4_ - fStack_b64;
      fStack_d00 = fStack_c90 - fStack_b60;
      fStack_cfc = fStack_c8c - fStack_b5c;
      local_c48 = CONCAT44(fVar176,fVar165);
      uStack_c40 = CONCAT44(fVar180,fVar178);
      fVar89 = fVar174 - fVar73;
      fVar151 = fVar124 - fVar86;
      fVar117 = fVar129 - fVar88;
      fVar123 = fVar130 - fVar90;
      fVar139 = (fVar165 * (local_b68 + fVar131) - (local_b78 + fVar158) * fVar141) * fStack_c5c +
                ((fVar182 + fVar174) * fVar141 - (local_b68 + fVar131) * fVar171) * fStack_c50 +
                (fVar171 * (local_b78 + fVar158) - (fVar182 + fVar174) * fVar165) * fVar183;
      fVar140 = (fVar176 * (fStack_b64 + fVar132) - (fStack_b74 + fVar159) * fVar145) * fStack_c5c +
                ((fVar179 + fVar124) * fVar145 - (fStack_b64 + fVar132) * fVar173) * fStack_c50 +
                (fVar173 * (fStack_b74 + fVar159) - (fVar179 + fVar124) * fVar176) * fVar183;
      local_c38 = CONCAT44(fVar140,fVar139);
      fStack_c30 = (fVar178 * (fStack_b60 + fVar134) - (fStack_b70 + fVar160) * fVar153) *
                   fStack_c5c +
                   ((fVar181 + fVar129) * fVar153 - (fStack_b60 + fVar134) * fStack_ca0) *
                   fStack_c50 +
                   (fStack_ca0 * (fStack_b70 + fVar160) - (fVar181 + fVar129) * fVar178) * fVar183;
      register0x0000140c =
           (fVar180 * (fStack_b5c + fStack_b1c) - (fStack_b6c + fStack_b2c) * fVar155) * fStack_c5c
           + ((fVar72 + fVar130) * fVar155 - (fStack_b5c + fStack_b1c) * fStack_c9c) * fStack_c50 +
             (fStack_c9c * (fStack_b6c + fStack_b2c) - (fVar72 + fVar130) * fVar180) * fVar183;
      fVar144 = fVar158 - local_b18;
      fVar146 = fVar159 - fStack_b14;
      fVar154 = fVar160 - fStack_b10;
      fVar157 = fStack_b2c - fStack_b0c;
      fVar135 = fVar131 - (float)local_c98;
      fVar136 = fVar132 - local_c98._4_4_;
      fVar137 = fVar134 - fStack_c90;
      fVar138 = fStack_b1c - fStack_c8c;
      local_c08 = CONCAT44(fVar136,fVar135);
      uStack_c00 = CONCAT44(fVar138,fVar137);
      local_c18 = (fVar144 * ((float)local_c98 + fVar131) - (local_b18 + fVar158) * fVar135) *
                  fStack_c5c +
                  ((fVar174 + fVar73) * fVar135 - ((float)local_c98 + fVar131) * fVar89) *
                  fStack_c50 +
                  (fVar89 * (local_b18 + fVar158) - (fVar174 + fVar73) * fVar144) * fVar183;
      fStack_c14 = (fVar146 * (local_c98._4_4_ + fVar132) - (fStack_b14 + fVar159) * fVar136) *
                   fStack_c5c +
                   ((fVar124 + fVar86) * fVar136 - (local_c98._4_4_ + fVar132) * fVar151) *
                   fStack_c50 +
                   (fVar151 * (fStack_b14 + fVar159) - (fVar124 + fVar86) * fVar146) * fVar183;
      fStack_c10 = (fVar154 * (fStack_c90 + fVar134) - (fStack_b10 + fVar160) * fVar137) *
                   fStack_c5c +
                   ((fVar129 + fVar88) * fVar137 - (fStack_c90 + fVar134) * fVar117) * fStack_c50 +
                   (fVar117 * (fStack_b10 + fVar160) - (fVar129 + fVar88) * fVar154) * fVar183;
      fStack_c0c = (fVar157 * (fStack_c8c + fStack_b1c) - (fStack_b0c + fStack_b2c) * fVar138) *
                   fStack_c5c +
                   ((fVar130 + fVar90) * fVar138 - (fStack_c8c + fStack_b1c) * fVar123) * fStack_c50
                   + (fVar123 * (fStack_b0c + fStack_b2c) - (fVar130 + fVar90) * fVar157) * fVar183;
      fVar161 = fVar73 - fVar182;
      fVar162 = fVar86 - fVar179;
      fVar163 = fVar88 - fVar181;
      fVar164 = fVar90 - fVar72;
      _local_c58 = CONCAT44(fStack_c50,fStack_c50);
      auVar81._0_4_ =
           (fVar74 * local_b48 - local_b58 * fVar87) * fStack_c5c +
           ((fVar182 + fVar73) * fVar87 - local_b48 * fVar161) * fStack_c50 +
           (fVar161 * local_b58 - (fVar182 + fVar73) * fVar74) * fVar183;
      auVar81._4_4_ =
           (fVar91 * fStack_b44 - fStack_b54 * fVar149) * fStack_c5c +
           ((fVar179 + fVar86) * fVar149 - fStack_b44 * fVar162) * fStack_c50 +
           (fVar162 * fStack_b54 - (fVar179 + fVar86) * fVar91) * fVar183;
      auVar81._8_4_ =
           (fVar152 * fStack_b40 - fStack_b50 * fStack_d00) * fStack_c5c +
           ((fVar181 + fVar88) * fStack_d00 - fStack_b40 * fVar163) * fStack_c50 +
           (fVar163 * fStack_b50 - (fVar181 + fVar88) * fVar152) * fVar183;
      auVar81._12_4_ =
           (fVar169 * fStack_b3c - fStack_b4c * fStack_cfc) * fStack_c5c +
           ((fVar72 + fVar90) * fStack_cfc - fStack_b3c * fVar164) * fStack_c50 +
           (fVar164 * fStack_b4c - (fVar72 + fVar90) * fVar169) * fVar183;
      local_c28 = fVar139 + local_c18 + auVar81._0_4_;
      fStack_c24 = fVar140 + fStack_c14 + auVar81._4_4_;
      fStack_c20 = fStack_c30 + fStack_c10 + auVar81._8_4_;
      fStack_c1c = register0x0000140c + fStack_c0c + auVar81._12_4_;
      auVar99._8_4_ = fStack_c30;
      auVar99._0_8_ = local_c38;
      auVar99._12_4_ = register0x0000140c;
      auVar43._4_4_ = fStack_c14;
      auVar43._0_4_ = local_c18;
      auVar43._8_4_ = fStack_c10;
      auVar43._12_4_ = fStack_c0c;
      auVar107 = minps(auVar99,auVar43);
      auVar107 = minps(auVar107,auVar81);
      auVar167._8_4_ = fStack_c30;
      auVar167._0_8_ = local_c38;
      auVar167._12_4_ = register0x0000140c;
      auVar44._4_4_ = fStack_c14;
      auVar44._0_4_ = local_c18;
      auVar44._8_4_ = fStack_c10;
      auVar44._12_4_ = fStack_c0c;
      auVar120 = maxps(auVar167,auVar44);
      auVar120 = maxps(auVar120,auVar81);
      fVar90 = (float)((uint)local_c28 & auVar92._0_4_);
      fVar182 = (float)((uint)fStack_c24 & auVar92._4_4_);
      fVar179 = (float)((uint)fStack_c20 & auVar92._8_4_);
      fVar181 = (float)((uint)fStack_c1c & auVar92._12_4_);
      fVar72 = fVar90 * 1.1920929e-07;
      fVar73 = fVar182 * 1.1920929e-07;
      fVar86 = fVar179 * 1.1920929e-07;
      fVar88 = fVar181 * 1.1920929e-07;
      auVar168._4_4_ = -(uint)(auVar120._4_4_ <= fVar73);
      auVar168._0_4_ = -(uint)(auVar120._0_4_ <= fVar72);
      auVar168._8_4_ = -(uint)(auVar120._8_4_ <= fVar86);
      auVar168._12_4_ = -(uint)(auVar120._12_4_ <= fVar88);
      auVar100._4_4_ = -(uint)(-fVar73 <= auVar107._4_4_);
      auVar100._0_4_ = -(uint)(-fVar72 <= auVar107._0_4_);
      auVar100._8_4_ = -(uint)(-fVar86 <= auVar107._8_4_);
      auVar100._12_4_ = -(uint)(-fVar88 <= auVar107._12_4_);
      auVar168 = auVar168 | auVar100;
      iVar61 = movmskps(uVar56,auVar168);
      if (iVar61 != 0) {
        auVar148._0_4_ = fVar165 * fVar135 - fVar144 * fVar141;
        auVar148._4_4_ = fVar176 * fVar136 - fVar146 * fVar145;
        auVar148._8_4_ = fVar178 * fVar137 - fVar154 * fVar153;
        auVar148._12_4_ = fVar180 * fVar138 - fVar157 * fVar155;
        auVar150._0_4_ = fVar144 * fVar87 - fVar74 * fVar135;
        auVar150._4_4_ = fVar146 * fVar149 - fVar91 * fVar136;
        auVar150._8_4_ = fVar154 * fStack_d00 - fVar152 * fVar137;
        auVar150._12_4_ = fVar157 * fStack_cfc - fVar169 * fVar138;
        auVar82._4_4_ = -(uint)(ABS(fVar146 * fVar145) < ABS(fVar91 * fVar136));
        auVar82._0_4_ = -(uint)(ABS(fVar144 * fVar141) < ABS(fVar74 * fVar135));
        auVar82._8_4_ = -(uint)(ABS(fVar154 * fVar153) < ABS(fVar152 * fVar137));
        auVar82._12_4_ = -(uint)(ABS(fVar157 * fVar155) < ABS(fVar169 * fVar138));
        fVar170 = (float)DAT_01f46a60;
        fVar172 = DAT_01f46a60._4_4_;
        fVar175 = DAT_01f46a60._12_4_;
        local_a68 = blendvps(auVar150,auVar148,auVar82);
        auVar121._0_4_ = fVar141 * fVar89 - fVar171 * fVar135;
        auVar121._4_4_ = fVar145 * fVar151 - fVar173 * fVar136;
        auVar121._8_4_ = fVar153 * fVar117 - fStack_ca0 * fVar137;
        auVar121._12_4_ = fVar155 * fVar123 - fStack_c9c * fVar138;
        auVar156._0_4_ = fVar161 * fVar135 - fVar89 * fVar87;
        auVar156._4_4_ = fVar162 * fVar136 - fVar151 * fVar149;
        auVar156._8_4_ = fVar163 * fVar137 - fVar117 * fStack_d00;
        auVar156._12_4_ = fVar164 * fVar138 - fVar123 * fStack_cfc;
        auVar83._4_4_ = -(uint)(ABS(fVar173 * fVar136) < ABS(fVar151 * fVar149));
        auVar83._0_4_ = -(uint)(ABS(fVar171 * fVar135) < ABS(fVar89 * fVar87));
        auVar83._8_4_ = -(uint)(ABS(fStack_ca0 * fVar137) < ABS(fVar117 * fStack_d00));
        auVar83._12_4_ = -(uint)(ABS(fStack_c9c * fVar138) < ABS(fVar123 * fStack_cfc));
        local_a58 = blendvps(auVar156,auVar121,auVar83);
        auVar122._0_4_ = fVar89 * fVar74 - fVar161 * fVar144;
        auVar122._4_4_ = fVar151 * fVar91 - fVar162 * fVar146;
        auVar122._8_4_ = fVar117 * fVar152 - fVar163 * fVar154;
        auVar122._12_4_ = fVar123 * fVar169 - fVar164 * fVar157;
        auVar84._4_4_ = -(uint)(ABS(fVar151 * fVar176) < ABS(fVar162 * fVar146));
        auVar84._0_4_ = -(uint)(ABS(fVar89 * fVar165) < ABS(fVar161 * fVar144));
        auVar84._8_4_ = -(uint)(ABS(fVar117 * fVar178) < ABS(fVar163 * fVar154));
        auVar84._12_4_ = -(uint)(ABS(fVar123 * fVar180) < ABS(fVar164 * fVar157));
        auVar41._4_4_ = fVar173 * fVar146 - fVar151 * fVar176;
        auVar41._0_4_ = fVar171 * fVar144 - fVar89 * fVar165;
        auVar41._8_4_ = fStack_ca0 * fVar154 - fVar117 * fVar178;
        auVar41._12_4_ = fStack_c9c * fVar157 - fVar123 * fVar180;
        local_a48 = blendvps(auVar122,auVar41,auVar84);
        fVar72 = fStack_c5c * local_a68._0_4_ +
                 fStack_c50 * local_a58._0_4_ + fVar183 * local_a48._0_4_;
        fVar73 = fStack_c5c * local_a68._4_4_ +
                 fStack_c50 * local_a58._4_4_ + fVar183 * local_a48._4_4_;
        fVar74 = fStack_c5c * local_a68._8_4_ +
                 fStack_c50 * local_a58._8_4_ + fVar183 * local_a48._8_4_;
        fVar183 = fStack_c5c * local_a68._12_4_ +
                  fStack_c50 * local_a58._12_4_ + fVar183 * local_a48._12_4_;
        auVar128._0_4_ = fVar72 + fVar72;
        auVar128._4_4_ = fVar73 + fVar73;
        auVar128._8_4_ = fVar74 + fVar74;
        auVar128._12_4_ = fVar183 + fVar183;
        auVar101._0_4_ = fVar131 * local_a48._0_4_;
        auVar101._4_4_ = fVar132 * local_a48._4_4_;
        auVar101._8_4_ = fVar134 * local_a48._8_4_;
        auVar101._12_4_ = fStack_b1c * local_a48._12_4_;
        fVar87 = fVar174 * local_a68._0_4_ + fVar158 * local_a58._0_4_ + auVar101._0_4_;
        fVar88 = fVar124 * local_a68._4_4_ + fVar159 * local_a58._4_4_ + auVar101._4_4_;
        fVar89 = fVar129 * local_a68._8_4_ + fVar160 * local_a58._8_4_ + auVar101._8_4_;
        fVar91 = fVar130 * local_a68._12_4_ + fStack_b2c * local_a58._12_4_ + auVar101._12_4_;
        auVar92 = rcpps(auVar101,auVar128);
        fVar72 = auVar92._0_4_;
        fVar183 = auVar92._4_4_;
        fVar74 = auVar92._8_4_;
        fVar86 = auVar92._12_4_;
        fVar73 = DAT_01f46a60._8_4_;
        local_a78._0_4_ =
             ((fVar170 - auVar128._0_4_ * fVar72) * fVar72 + fVar72) * (fVar87 + fVar87);
        local_a78._4_4_ =
             ((fVar172 - auVar128._4_4_ * fVar183) * fVar183 + fVar183) * (fVar88 + fVar88);
        fStack_a70 = ((fVar73 - auVar128._8_4_ * fVar74) * fVar74 + fVar74) * (fVar89 + fVar89);
        fStack_a6c = ((fVar175 - auVar128._12_4_ * fVar86) * fVar86 + fVar86) * (fVar91 + fVar91);
        fVar72 = *(float *)(ray + k * 4 + 0x80);
        fVar183 = *(float *)(ray + k * 4 + 0x30);
        auVar112._4_4_ = -(uint)(fVar183 <= (float)local_a78._4_4_);
        auVar112._0_4_ = -(uint)(fVar183 <= (float)local_a78._0_4_);
        auVar112._8_4_ = -(uint)(fVar183 <= fStack_a70);
        auVar112._12_4_ = -(uint)(fVar183 <= fStack_a6c);
        auVar102._0_4_ =
             -(uint)((float)local_a78._0_4_ <= fVar72 && fVar183 <= (float)local_a78._0_4_) &
             auVar168._0_4_;
        auVar102._4_4_ =
             -(uint)((float)local_a78._4_4_ <= fVar72 && fVar183 <= (float)local_a78._4_4_) &
             auVar168._4_4_;
        auVar102._8_4_ = -(uint)(fStack_a70 <= fVar72 && fVar183 <= fStack_a70) & auVar168._8_4_;
        auVar102._12_4_ = -(uint)(fStack_a6c <= fVar72 && fVar183 <= fStack_a6c) & auVar168._12_4_;
        iVar61 = movmskps(iVar61,auVar102);
        fStack_d20 = fVar117;
        fStack_d1c = fVar123;
        if ((iVar61 != 0) &&
           (auVar103._0_4_ = auVar102._0_4_ & -(uint)(auVar128._0_4_ != 0.0),
           auVar103._4_4_ = auVar102._4_4_ & -(uint)(auVar128._4_4_ != 0.0),
           auVar103._8_4_ = auVar102._8_4_ & -(uint)(auVar128._8_4_ != 0.0),
           auVar103._12_4_ = auVar102._12_4_ & -(uint)(auVar128._12_4_ != 0.0),
           uVar56 = movmskps(iVar61,auVar103), uVar56 != 0)) {
          auVar49._4_4_ = fStack_c24;
          auVar49._0_4_ = local_c28;
          auVar49._8_4_ = fStack_c20;
          auVar49._12_4_ = fStack_c1c;
          local_a38 = local_888;
          pSVar64 = context->scene;
          auVar92 = rcpps(auVar112,auVar49);
          fVar183 = auVar92._0_4_;
          fVar74 = auVar92._4_4_;
          fVar86 = auVar92._8_4_;
          fVar87 = auVar92._12_4_;
          fVar183 = (float)(-(uint)(1e-18 <= fVar90) &
                           (uint)((fVar170 - local_c28 * fVar183) * fVar183 + fVar183));
          fVar74 = (float)(-(uint)(1e-18 <= fVar182) &
                          (uint)((fVar172 - fStack_c24 * fVar74) * fVar74 + fVar74));
          fVar86 = (float)(-(uint)(1e-18 <= fVar179) &
                          (uint)((fVar73 - fStack_c20 * fVar86) * fVar86 + fVar86));
          fVar87 = (float)(-(uint)(1e-18 <= fVar181) &
                          (uint)((fVar175 - fStack_c1c * fVar87) * fVar87 + fVar87));
          auVar143._0_4_ = fVar139 * fVar183;
          auVar143._4_4_ = fVar140 * fVar74;
          auVar143._8_4_ = fStack_c30 * fVar86;
          auVar143._12_4_ = register0x0000140c * fVar87;
          auVar92 = minps(auVar143,_DAT_01f46a60);
          auVar185._0_4_ = fVar183 * local_c18;
          auVar185._4_4_ = fVar74 * fStack_c14;
          auVar185._8_4_ = fVar86 * fStack_c10;
          auVar185._12_4_ = fVar87 * fStack_c0c;
          auVar107 = minps(auVar185,_DAT_01f46a60);
          auVar104._0_4_ = fVar170 - auVar92._0_4_;
          auVar104._4_4_ = fVar172 - auVar92._4_4_;
          auVar104._8_4_ = fVar73 - auVar92._8_4_;
          auVar104._12_4_ = fVar175 - auVar92._12_4_;
          auVar113._0_4_ = fVar170 - auVar107._0_4_;
          auVar113._4_4_ = fVar172 - auVar107._4_4_;
          auVar113._8_4_ = fVar73 - auVar107._8_4_;
          auVar113._12_4_ = fVar175 - auVar107._12_4_;
          local_a98 = blendvps(auVar92,auVar104,local_888);
          local_a88 = blendvps(auVar107,auVar113,local_888);
          uVar69 = (ulong)(uVar56 & 0xff);
          local_c68 = fStack_c5c;
          fStack_c64 = fStack_c5c;
          fStack_c60 = fStack_c5c;
          fStack_c4c = fStack_c50;
          do {
            uVar52 = 0;
            if (uVar69 != 0) {
              for (; (uVar69 >> uVar52 & 1) == 0; uVar52 = uVar52 + 1) {
              }
            }
            local_9c8 = *(uint *)(lVar1 + 0x40 + uVar52 * 4);
            pGVar27 = (pSVar64->geometries).items[local_9c8].ptr;
            if ((pGVar27->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar27->occlusionFilterN == (RTCFilterFunctionN)0x0)) goto LAB_00720fa1;
              local_9f8 = *(undefined4 *)(local_a98 + uVar52 * 4);
              uVar24 = *(undefined4 *)(local_a88 + uVar52 * 4);
              *(undefined4 *)(ray + k * 4 + 0x80) = *(undefined4 *)(local_a78 + uVar52 * 4);
              args.context = context->user;
              uVar25 = *(undefined4 *)(lVar1 + 0x50 + uVar52 * 4);
              local_9d8._4_4_ = uVar25;
              local_9d8._0_4_ = uVar25;
              local_9d8._8_4_ = uVar25;
              local_9d8._12_4_ = uVar25;
              local_9e8._4_4_ = uVar24;
              local_9e8._0_4_ = uVar24;
              local_9e8._8_4_ = uVar24;
              local_9e8._12_4_ = uVar24;
              uVar24 = *(undefined4 *)(local_a68 + uVar52 * 4);
              local_a18._4_4_ = *(undefined4 *)(local_a58 + uVar52 * 4);
              local_a08._4_4_ = *(undefined4 *)(local_a48 + uVar52 * 4);
              local_a28._4_4_ = uVar24;
              local_a28._0_4_ = uVar24;
              local_a28._8_4_ = uVar24;
              local_a28._12_4_ = uVar24;
              local_a18._0_4_ = local_a18._4_4_;
              local_a18._8_4_ = local_a18._4_4_;
              local_a18._12_4_ = local_a18._4_4_;
              local_a08._0_4_ = local_a08._4_4_;
              local_a08._8_4_ = local_a08._4_4_;
              local_a08._12_4_ = local_a08._4_4_;
              uStack_9f4 = local_9f8;
              uStack_9f0 = local_9f8;
              uStack_9ec = local_9f8;
              uStack_9c4 = local_9c8;
              uStack_9c0 = local_9c8;
              uStack_9bc = local_9c8;
              local_9b8 = (args.context)->instID[0];
              uStack_9b4 = local_9b8;
              uStack_9b0 = local_9b8;
              uStack_9ac = local_9b8;
              local_9a8 = (args.context)->instPrimID[0];
              uStack_9a4 = local_9a8;
              uStack_9a0 = local_9a8;
              uStack_99c = local_9a8;
              local_c88 = *local_bf0;
              args.valid = (int *)local_c88;
              args.geometryUserPtr = pGVar27->userPtr;
              args.hit = (RTCHitN *)local_a28;
              args.N = 4;
              args.ray = (RTCRayN *)ray;
              if (pGVar27->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                (*pGVar27->occlusionFilterN)(&args);
              }
              if (local_c88 == (undefined1  [16])0x0) {
                auVar105._8_4_ = 0xffffffff;
                auVar105._0_8_ = 0xffffffffffffffff;
                auVar105._12_4_ = 0xffffffff;
                auVar105 = auVar105 ^ _DAT_01f46b70;
              }
              else {
                p_Var35 = context->args->filter;
                if ((p_Var35 != (RTCFilterFunctionN)0x0) &&
                   (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                     RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar27->field_8).field_0x2 & 0x40) != 0)))
                   ) {
                  (*p_Var35)(&args);
                }
                auVar85._0_4_ = -(uint)(local_c88._0_4_ == 0);
                auVar85._4_4_ = -(uint)(local_c88._4_4_ == 0);
                auVar85._8_4_ = -(uint)(local_c88._8_4_ == 0);
                auVar85._12_4_ = -(uint)(local_c88._12_4_ == 0);
                auVar105 = auVar85 ^ _DAT_01f46b70;
                auVar92 = blendvps(_DAT_01f45a40,*(undefined1 (*) [16])(args.ray + 0x80),auVar85);
                *(undefined1 (*) [16])(args.ray + 0x80) = auVar92;
              }
              if ((_DAT_01f46b40 & auVar105) != (undefined1  [16])0x0) goto LAB_00720fa1;
              *(float *)(ray + k * 4 + 0x80) = fVar72;
            }
            uVar69 = uVar69 ^ 1L << (uVar52 & 0x3f);
          } while (uVar69 != 0);
        }
      }
    }
  } while( true );
LAB_00720fa1:
  *(undefined4 *)(ray + k * 4 + 0x80) = 0xff800000;
  goto LAB_00720fad;
}

Assistant:

bool BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded1(Accel::Intersectors* This,
                                                                                               const BVH* bvh,
                                                                                               NodeRef root,
                                                                                               size_t k,
                                                                                               Precalculations& pre,
                                                                                               RayK<K>& ray,
                                                                                               const TravRayK<K, robust>& tray,
                                                                                               RayQueryContext* context)
      {
        /* stack state */
        NodeRef stack[stackSizeSingle];  // stack of nodes that still need to get traversed
        NodeRef* stackPtr = stack+1;     // current stack pointer
	NodeRef* stackEnd = stack+stackSizeSingle;
        stack[0] = root;

        /* load the ray into SIMD registers */
        TravRay<N,robust> tray1;
        tray1.template init<K>(k, tray.org, tray.dir, tray.rdir, tray.nearXYZ, tray.tnear[k], tray.tfar[k]);

	/* pop loop */
	while (true) pop:
	{
          /* pop next node */
	  if (unlikely(stackPtr == stack)) break;
	  stackPtr--;
          NodeRef cur = (NodeRef)*stackPtr;

          /* downtraversal loop */
          while (true)
          {
            /* intersect node */
            size_t mask; vfloat<N> tNear;
            STAT3(shadow.trav_nodes, 1, 1, 1);
            bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray1, ray.time()[k], tNear, mask);
            if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

            /* if no child is hit, pop next node */
            if (unlikely(mask == 0))
              goto pop;

            /* select next child and push other children */
            BVHNNodeTraverser1Hit<N, types>::traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
          }

          /* this is a leaf node */
          assert(cur != BVH::emptyNode);
          STAT3(shadow.trav_leaves, 1, 1, 1);
          size_t num; Primitive* prim = (Primitive*)cur.leaf(num);

          size_t lazy_node = 0;
          if (PrimitiveIntersectorK::occluded(This, pre, ray, k, context, prim, num, tray1, lazy_node)) {
	    ray.tfar[k] = neg_inf;
	    return true;
	  }

          if (unlikely(lazy_node)) {
            *stackPtr = lazy_node;
            stackPtr++;
          }
	}
	return false;
      }